

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O2

bool __thiscall
OpenMD::ForceDecomposition::checkNeighborList
          (ForceDecomposition *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  Snapshot *pSVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Vector<double,_3U> local_60;
  Vector3d disp;
  
  pSVar1 = this->snap_;
  lVar3 = (long)(pSVar1->cgData).position.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar1->cgData).position.
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  dVar5 = this->skinThickness_;
  lVar2 = lVar3 / 0x18;
  if (this->needVelocities_ == true) {
    DataStorage::setStorageLayout(&pSVar1->cgData,3);
  }
  bVar4 = true;
  if ((long)(savedPositions->
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(savedPositions->
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
            _M_impl.super__Vector_impl_data._M_start == lVar3) {
    dVar5 = dVar5 * 0.5;
    Vector<double,_3U>::Vector(&disp.super_Vector<double,_3U>);
    lVar3 = 0;
    dVar6 = 0.0;
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
      operator-(&local_60,
                (Vector<double,_3U> *)
                ((long)(((this->snap_->cgData).position.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_
                + lVar3),(Vector<double,_3U> *)
                         ((long)(((savedPositions->
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super_Vector<double,_3U>).data_ + lVar3));
      Vector3<double>::operator=((Vector3<double> *)&disp.super_Vector<double,_3U>,&local_60);
      dVar7 = Vector<double,_3U>::lengthSquare(&disp.super_Vector<double,_3U>);
      if (dVar7 <= dVar6) {
        dVar7 = dVar6;
      }
      lVar3 = lVar3 + 0x18;
      dVar6 = dVar7;
    }
    bVar4 = dVar5 * dVar5 < dVar6;
  }
  return bVar4;
}

Assistant:

bool ForceDecomposition::checkNeighborList(vector<Vector3d> savedPositions) {
    RealType st2        = pow(skinThickness_ / 2.0, 2);
    std::size_t nGroups = snap_->cgData.position.size();
    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);

    // if we have changed the group identities or haven't set up the
    // saved positions we automatically will need a neighbor list update:

    if (savedPositions.size() != nGroups) return true;

    RealType dispmax = 0.0;
    Vector3d disp;

    for (std::size_t i = 0; i < nGroups; i++) {
      disp    = snap_->cgData.position[i] - savedPositions[i];
      dispmax = max(dispmax, disp.lengthSquare());
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &dispmax, 1, MPI_REALTYPE, MPI_MAX,
                  MPI_COMM_WORLD);
#endif

    return (dispmax > st2) ? true : false;
  }